

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv4transmitter.cpp
# Opt level: O1

int __thiscall jrtplib::RTPUDPv4Transmitter::AbortWait(RTPUDPv4Transmitter *this)

{
  int iVar1;
  
  iVar1 = -0x5a;
  if (((this->init == true) && (iVar1 = -0x59, this->created == true)) &&
     (iVar1 = -0x5b, this->waitingfordata == true)) {
    RTPAbortDescriptors::SendAbortSignal(this->m_pAbortDesc);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int RTPUDPv4Transmitter::AbortWait()
{
	if (!init)
		return ERR_RTP_UDPV4TRANS_NOTINIT;
	
	MAINMUTEX_LOCK
	if (!created)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV4TRANS_NOTCREATED;
	}
	if (!waitingfordata)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV4TRANS_NOTWAITING;
	}

	m_pAbortDesc->SendAbortSignal();
	
	MAINMUTEX_UNLOCK
	return 0;
}